

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5DlidxIterNextR(Fts5Index *p,Fts5DlidxIter *pIter,int iLvl)

{
  int iVar1;
  Fts5Data *pFVar2;
  int in_EDX;
  Fts5Index *in_RSI;
  Fts5DlidxLvl *pLvl;
  Fts5DlidxLvl *pLvl_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  pLvl_00 = (Fts5DlidxLvl *)(&in_RSI->zDataTbl + (long)in_EDX * 4);
  iVar1 = fts5DlidxLvlNext(pLvl_00);
  if (((iVar1 != 0) && (in_EDX + 1 < *(int *)&in_RSI->pConfig)) &&
     (fts5DlidxIterNextR(in_RSI,(Fts5DlidxIter *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                         (int)((ulong)pLvl_00 >> 0x20)), pLvl_00[1].bEof == 0)) {
    fts5DataRelease((Fts5Data *)0x270d31);
    memset(pLvl_00,0,0x20);
    pFVar2 = fts5DataRead(p,(i64)pIter);
    pLvl_00->pData = pFVar2;
    if (pLvl_00->pData != (Fts5Data *)0x0) {
      fts5DlidxLvlNext(pLvl_00);
    }
  }
  return *(int *)&in_RSI->field_0x14;
}

Assistant:

static int fts5DlidxIterNextR(Fts5Index *p, Fts5DlidxIter *pIter, int iLvl){
  Fts5DlidxLvl *pLvl = &pIter->aLvl[iLvl];

  assert( iLvl<pIter->nLvl );
  if( fts5DlidxLvlNext(pLvl) ){
    if( (iLvl+1) < pIter->nLvl ){
      fts5DlidxIterNextR(p, pIter, iLvl+1);
      if( pLvl[1].bEof==0 ){
        fts5DataRelease(pLvl->pData);
        memset(pLvl, 0, sizeof(Fts5DlidxLvl));
        pLvl->pData = fts5DataRead(p,
            FTS5_DLIDX_ROWID(pIter->iSegid, iLvl, pLvl[1].iLeafPgno)
        );
        if( pLvl->pData ) fts5DlidxLvlNext(pLvl);
      }
    }
  }

  return pIter->aLvl[0].bEof;
}